

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zvgPort.c
# Opt level: O2

uint zvgEnv(uint *portAdr,uint *monitor)

{
  char *pcVar1;
  char *in_RAX;
  char *__nptr;
  __int32_t **pp_Var2;
  ushort **ppuVar3;
  ulong uVar4;
  int __base;
  char cVar5;
  long lVar6;
  uint *puVar7;
  char *local_38;
  
  local_38 = in_RAX;
  __nptr = getenv("ZVGPORT");
  if (__nptr == (char *)0x0) {
    return 1;
  }
LAB_00103dc3:
  cVar5 = *__nptr;
  if (cVar5 == '\0') {
    return 0;
  }
  while (cVar5 == ' ') {
    pcVar1 = __nptr + 1;
    __nptr = __nptr + 1;
    cVar5 = *pcVar1;
  }
  pp_Var2 = __ctype_toupper_loc();
  do {
    lVar6 = (long)__nptr[1];
    __nptr = __nptr + 1;
  } while (lVar6 == 0x20);
  local_38 = __nptr;
  if ((char)(*pp_Var2)[cVar5] != 'M') goto code_r0x00103e05;
  ppuVar3 = __ctype_b_loc();
  __base = 10;
  puVar7 = monitor;
  if ((*(byte *)((long)*ppuVar3 + lVar6 * 2 + 1) & 8) == 0) {
    return 6;
  }
  goto LAB_00103e3a;
code_r0x00103e05:
  if ((char)(*pp_Var2)[cVar5] == 'P') {
    ppuVar3 = __ctype_b_loc();
    __base = 0x10;
    puVar7 = portAdr;
    if ((*(byte *)((long)*ppuVar3 + lVar6 * 2 + 1) & 8) == 0) {
      return 2;
    }
LAB_00103e3a:
    uVar4 = strtoul(__nptr,&local_38,__base);
    *puVar7 = (uint)uVar4;
    __nptr = local_38;
  }
  goto LAB_00103dc3;
}

Assistant:

uint zvgEnv( uint *portAdr, uint *monitor)
{
	char	*env, *envP, cmd;

	env = getenv("ZVGPORT");				// look for environment variable

	if (env == NULL)
		return (errNoEnv);					// no environment variable found

	// Look for 'P', 'D' or 'I' attributes
	envP = env;									// point to environment string

	while (*envP != '\0')
	{
		while (*envP == ' ')					// skip leading blanks
			envP++;

		cmd = toupper( *envP);
		envP++;									// skip command character

		while (*envP == ' ')
			envP++;								// skip blanks

		// decode attribute

		switch (cmd)
		{
		case 'P':								// check for 'P'ort address
			if (!isdigit( *envP))
				return (errEnvPort);			// bad environment port value

			*portAdr = strtoul( envP, &envP, 16);	// read port address
			break;

		case 'M':								// or check for 'M'onitor type
			if (!isdigit( *envP))
				return (errEnvMon);			// bad environment monitor value

			*monitor = strtoul( envP, &envP, 10);		// read monitor type
			break;
		}
	}
	return (errOk);
}